

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_dse_ahstore(jit_State *J)

{
  IRIns *pIVar1;
  IRRef1 IVar2;
  ushort uVar3;
  IRIns *pIVar4;
  uint uVar5;
  AliasRet AVar6;
  TRef TVar7;
  IRIns *local_50;
  IRIns *ir;
  IRIns *store;
  IRRef1 *pIStack_38;
  IRRef ref;
  IRRef1 *refp;
  IRIns *xr;
  IRRef val;
  IRRef xref;
  jit_State *J_local;
  
  uVar5 = (uint)(J->fold).ins.field_0.op1;
  IVar2 = (J->fold).ins.field_0.op2;
  pIVar4 = (J->cur).ir;
  pIStack_38 = J->chain + (J->fold).ins.field_1.o;
  uVar3 = *pIStack_38;
  while (store._4_4_ = (uint)uVar3, uVar5 < store._4_4_) {
    pIVar1 = (J->cur).ir + store._4_4_;
    AVar6 = aa_ahref(J,pIVar4 + uVar5,(J->cur).ir + (pIVar1->field_0).op1);
    if (AVar6 != ALIAS_NO) {
      if (AVar6 == ALIAS_MAY) {
        if ((pIVar1->field_0).op2 != IVar2) break;
      }
      else if (AVar6 == ALIAS_MUST) {
        if ((pIVar1->field_0).op2 == IVar2) {
          return 4;
        }
        if (J->chain[0x11] < store._4_4_) {
          local_50 = (J->cur).ir + ((J->cur).nins - 1);
          goto LAB_0014125e;
        }
        break;
      }
    }
    pIStack_38 = &(pIVar1->field_0).prev;
    uVar3 = (pIVar1->field_0).prev;
  }
LAB_001412f6:
  TVar7 = lj_ir_emit(J);
  return TVar7;
LAB_0014125e:
  if (local_50 <= pIVar1) goto LAB_00141299;
  if ((((local_50->field_1).t.irt & 0x80) != 0) || ((local_50->field_1).o == 'I'))
  goto LAB_001412f6;
  local_50 = local_50 + -1;
  goto LAB_0014125e;
LAB_00141299:
  *pIStack_38 = (pIVar1->field_0).prev;
  (pIVar1->field_0).ot = 0xc00;
  (pIVar1->field_0).op2 = 0;
  (pIVar1->field_0).op1 = 0;
  (pIVar1->field_0).prev = 0;
  goto LAB_001412f6;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ahstore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[fins->o];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads).
	** Note that lj_tab_keyindex and lj_vm_next don't need guards,
	** since they are followed by at least one guarded VLOAD.
	*/
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || ir->o == IR_ALEN)
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}